

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

type __thiscall obs::signal<int_()>::operator()<>(signal<int_()> *this)

{
  bool bVar1;
  slot<int_()> *this_00;
  slot<int_()> *slot;
  undefined1 local_70 [8];
  iterator __end0;
  iterator __begin0;
  slot_list *__range3;
  int result;
  signal<int_()> *this_local;
  
  __range3._4_4_ = 0;
  safe_list<obs::slot<int_()>_>::begin((iterator *)&__end0.m_next_iterator,&this->m_slots);
  safe_list<obs::slot<int_()>_>::end((iterator *)local_70,&this->m_slots);
  while( true ) {
    bVar1 = safe_list<obs::slot<int_()>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)local_70);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<int_()>_>::iterator::operator*
                        ((iterator *)&__end0.m_next_iterator);
    if (this_00 != (slot<int_()> *)0x0) {
      __range3._4_4_ = slot<int_()>::operator()<>(this_00);
    }
    safe_list<obs::slot<int_()>_>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<int_()>_>::iterator::~iterator((iterator *)local_70);
  safe_list<obs::slot<int_()>_>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  return __range3._4_4_;
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }